

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O0

void do_hobble(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  int *piVar5;
  int in_ESI;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af2;
  AFFECT_DATA af;
  bool special;
  OBJ_DATA *weapon;
  CHAR_DATA *victim;
  int skill;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 uVar6;
  int in_stack_fffffffffffffeac;
  CHAR_DATA *in_stack_fffffffffffffeb0;
  CHAR_DATA *pCVar7;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  CHAR_DATA *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int local_118;
  int local_114 [3];
  int local_108;
  int local_104 [7];
  undefined2 local_e6;
  short local_e4;
  short local_e2;
  short local_e0;
  undefined2 local_de;
  undefined2 local_dc;
  undefined4 local_c8;
  code *local_c0;
  undefined8 local_b0;
  undefined2 local_7e;
  int in_stack_ffffffffffffff84;
  undefined2 in_stack_ffffffffffffff8a;
  undefined1 success;
  int in_stack_ffffffffffffff8c;
  undefined2 uVar8;
  CHAR_DATA *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffac;
  CHAR_DATA *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  int in_stack_ffffffffffffffc4;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar9;
  
  success = (undefined1)((ushort)in_stack_ffffffffffffff8a >> 8);
  bVar9 = 0;
  iVar2 = get_skill(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (iVar2 == 0) {
    send_to_char((char *)in_stack_fffffffffffffec0,
                 (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  else {
    ch_00 = in_RDI->fighting;
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_fffffffffffffec0,
                   (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    else if (ch_00->legs < 1) {
      send_to_char((char *)in_stack_fffffffffffffec0,
                   (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    else if (ch_00->legs < 2) {
      send_to_char((char *)in_stack_fffffffffffffec0,
                   (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    else if ((int)ch_00->size < in_RDI->size + -1) {
      send_to_char((char *)in_stack_fffffffffffffec0,
                   (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    else {
      iVar3 = number_percent();
      if ((double)iVar3 < (double)iVar2 * 0.5) {
        bVar9 = 1;
      }
      pOVar4 = get_eq_char(in_RDI,0x10);
      if (pOVar4 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_fffffffffffffec0,
                     (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      }
      else {
        pCVar7 = (CHAR_DATA *)(ulong)(pOVar4->value[0] - 1);
        switch(pCVar7) {
        case (CHAR_DATA *)0x0:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          break;
        case (CHAR_DATA *)0x1:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          break;
        case (CHAR_DATA *)0x2:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          break;
        case (CHAR_DATA *)0x3:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          break;
        case (CHAR_DATA *)0x4:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          break;
        case (CHAR_DATA *)0x5:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          break;
        default:
          send_to_char((char *)in_stack_fffffffffffffec0,
                       (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          return;
        case (CHAR_DATA *)0x8:
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
          act((char *)in_stack_fffffffffffffec0,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0,
              (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
        }
        iVar3 = number_percent();
        if ((double)iVar2 * 0.75 <= (double)iVar3) {
          damage((CHAR_DATA *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),pCVar7,
                 (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(int)in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffecc,SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
          WAIT_STATE(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          check_improve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(bool)success,
                        in_stack_ffffffffffffff84);
        }
        else {
          if ((bVar9 & 1) == 0) {
            uVar6 = 0x50;
            pCVar7 = (CHAR_DATA *)0x0;
            one_hit_new((CHAR_DATA *)CONCAT17(bVar9,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                        (bool)in_stack_ffffffffffffffc3,(bool)in_stack_ffffffffffffffc2,
                        in_stack_ffffffffffffffbc,in_ESI,(char *)in_RDI);
            bVar1 = is_affected(ch_00,(int)gsn_hobble);
            if (!bVar1) {
              init_affect((AFFECT_DATA *)0x7196fb);
              local_7e = 0;
              in_stack_ffffffffffffff84 = CONCAT22(in_RDI->level,gsn_hobble);
              success = 0;
              in_stack_fffffffffffffec0 = (CHAR_DATA *)(ulong)(pOVar4->value[0] - 1);
              uVar8 = (undefined2)((uint)in_stack_ffffffffffffff8c >> 0x10);
              switch(in_stack_fffffffffffffec0) {
              case (CHAR_DATA *)0x0:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 0xc))
                ;
                break;
              case (CHAR_DATA *)0x1:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 8));
                break;
              case (CHAR_DATA *)0x2:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 0xc))
                ;
                break;
              case (CHAR_DATA *)0x3:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 10));
                break;
              case (CHAR_DATA *)0x4:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 0xc))
                ;
                break;
              case (CHAR_DATA *)0x5:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 10));
                break;
              case (CHAR_DATA *)0x8:
                in_stack_ffffffffffffff8c = CONCAT22(uVar8,-(short)((long)(int)in_RDI->level / 10));
              }
              affect_to_char(pCVar7,(AFFECT_DATA *)CONCAT44(in_stack_fffffffffffffeac,uVar6));
            }
          }
          else {
            init_affect((AFFECT_DATA *)0x718da1);
            uVar8 = (undefined2)((uint)in_stack_ffffffffffffff8c >> 0x10);
            local_7e = 0;
            pCVar7 = (CHAR_DATA *)(ulong)(pOVar4->value[0] - 1);
            switch(pCVar7) {
            case (CHAR_DATA *)0x0:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              init_affect((AFFECT_DATA *)0x71914f);
              local_e6 = 0;
              local_e0 = in_RDI->level / 0xf;
              local_e4 = gsn_bleeding;
              local_e2 = in_RDI->level;
              local_de = 0;
              local_dc = 0;
              local_c8 = 5;
              local_c0 = bleeding_tick;
              local_b0 = 0;
              new_affect_to_char(pCVar7,(AFFECT_DATA *)
                                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ));
              break;
            case (CHAR_DATA *)0x1:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              LAG_CHAR(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
              break;
            case (CHAR_DATA *)0x2:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              piVar5 = std::max<int>((int *)&stack0xfffffffffffffee4,(int *)&stack0xfffffffffffffee0
                                    );
              ch_00->move = (short)*piVar5;
              LAG_CHAR(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
              break;
            case (CHAR_DATA *)0x3:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              local_104[0] = (int)ch_00->move / 2;
              local_108 = 0;
              piVar5 = std::max<int>(local_104,&local_108);
              ch_00->move = (short)*piVar5;
              break;
            case (CHAR_DATA *)0x4:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              init_affect((AFFECT_DATA *)0x718fe6);
              local_e6 = 0;
              local_e0 = in_RDI->level / 0xf;
              local_e4 = gsn_bleeding;
              local_e2 = in_RDI->level;
              local_de = 0;
              local_dc = 0;
              local_c8 = 5;
              local_c0 = bleeding_tick;
              local_b0 = 0;
              new_affect_to_char(pCVar7,(AFFECT_DATA *)
                                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                ));
              break;
            case (CHAR_DATA *)0x5:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              local_114[2] = (int)ch_00->move / 2;
              local_114[1] = 0;
              piVar5 = std::max<int>(local_114 + 2,local_114 + 1);
              ch_00->move = (short)*piVar5;
              break;
            case (CHAR_DATA *)0x8:
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              act((char *)in_stack_fffffffffffffec0,
                  (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                  in_stack_fffffffffffffeb0,
                  (void *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
              affect_join(in_stack_fffffffffffffeb0,
                          (AFFECT_DATA *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
              local_114[0] = (int)ch_00->move / 2;
              local_118 = 0;
              piVar5 = std::max<int>(local_114,&local_118);
              ch_00->move = (short)*piVar5;
            }
            init_affect((AFFECT_DATA *)0x7195cc);
            local_7e = 0;
            in_stack_ffffffffffffff84 = CONCAT22(in_RDI->level,gsn_hobble);
            success = 0;
            in_stack_ffffffffffffff8c = CONCAT22(uVar8,0xffff);
            affect_to_char(in_stack_fffffffffffffeb0,
                           (AFFECT_DATA *)
                           CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            one_hit_new((CHAR_DATA *)CONCAT17(bVar9,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                        (bool)in_stack_ffffffffffffffc3,(bool)in_stack_ffffffffffffffc2,
                        in_stack_ffffffffffffffbc,in_ESI,(char *)in_RDI);
          }
          WAIT_STATE(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
          check_improve(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(bool)success,
                        in_stack_ffffffffffffff84);
        }
      }
    }
  }
  return;
}

Assistant:

void do_hobble(CHAR_DATA *ch, char *argument)
{
	int skill;
	CHAR_DATA *victim;
	OBJ_DATA *weapon;
	bool special = false;
	AFFECT_DATA af, af2;

	skill = get_skill(ch, gsn_hobble);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	victim = ch->fighting;

	if (victim == nullptr)
	{
		send_to_char("You must be in combat to do that!\n\r", ch);
		return;
	}

	if (victim->legs <= 0)
	{
		send_to_char("You cannot strike what does not exist.\n\r", ch);
		return;
	}
	else if (victim->legs <= 1)
	{
		send_to_char("They are already hobbled.\n\r", ch);
		return;
	}

	if (victim->size < ch->size - 1)
	{
		send_to_char("You cannot aim at such a small target.\n\r", ch);
		return;
	}

	if (number_percent() < .5 * skill)
		special = true;

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon != nullptr)
	{
		switch (weapon->value[0])
		{
			case WEAPON_MACE:
				act("You lower your mace near the ground and sweep at $N's legs!", ch, 0, victim, TO_CHAR);
				act("$n lowers $s mace near the ground and sweeps at your legs!", ch, 0, victim, TO_VICT);
				act("$n lowers $s mace near the ground and sweeps at $N's legs!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_AXE:
				act("Pivoting suddenly, you bring your axe down in an arc towards $N's feet!", ch, 0, victim, TO_CHAR);
				act("Pivoting suddenly, $n brings $s axe down in an arc towards your feet!", ch, 0, victim, TO_VICT);
				act("Pivoting suddenly, $n brings $s axe down in an arc towards $N's feet!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_SWORD:
				act("You drop your blade under $N's guard and strike at $S legs!", ch, 0, victim, TO_CHAR);
				act("$n drops $s blade under your guard and strikes at your legs!", ch, 0, victim, TO_VICT);
				act("$n drops $s blade under $N's guard and strikes at $S legs!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_FLAIL:
				act("Lashing out with your flail, you aim a sweeping blow at $N's legs!", ch, 0, victim, TO_CHAR);
				act("Lashing out with $s flail, $n aims a sweeping blow at your legs!", ch, 0, victim, TO_VICT);
				act("Lashing out with $s flail, $n aims a sweeping blow at $N's legs!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_STAFF:
				act("Twirling your staff rapidly, you unleash a snapping strike at $N's feet!", ch, 0, victim, TO_CHAR);
				act("Twirling $s staff rapidly, $n unleashes a snapping strike at your feet!", ch, 0, victim, TO_VICT);
				act("Twirling $s staff rapidly, $n unleashes a snapping strike at $N's feet!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_SPEAR:
				act("Stabbing suddenly, you aim a precise strike at $N's calf!", ch, 0, victim, TO_CHAR);
				act("Stabbing suddenly, $n aims a precise strike at your calf!", ch, 0, victim, TO_VICT);
				act("Stabbing suddenly, $n aims a precise strike at $N's calf!", ch, 0, victim, TO_NOTVICT);
				break;
			case WEAPON_DAGGER:
				act("You circle around $N and make a sweeping slash at $S calves!", ch, 0, victim, TO_CHAR);
				act("$n circles around you and makes a sweeping slash at your calves!", ch, 0, victim, TO_VICT);
				act("$n circles around $N and makes a sweeping slash at $S calves!", ch, 0, victim, TO_NOTVICT);
				break;
			default:
				send_to_char("You cannot properly strike your opponent's legs with that.\n\r", ch);
				return;
		}
	}
	else
	{
		send_to_char("You cannot execute that move barehanded!\n\r", ch);
		return;
	}

	if (number_percent() < .75 * skill)
	{
		if (special)
		{
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = ch->level / 8;
			af.type = gsn_hobble;
			af.level = ch->level;
			af.aftype = AFT_MALADY;

			switch (weapon->value[0])
			{
				case WEAPON_MACE:
					act("You hear the chilling sound of snapping bone as you land a solid blow.", ch, 0, victim, TO_CHAR);
					act("You hear the chilling sound of snapping bone as $n lands a solid blow.", ch, 0, victim, TO_ROOM);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 6);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move / 2, 0);
					break;
				case WEAPON_AXE:
					act("$N's leg buckles beneath $m as your slash tears deep into muscle!", ch, 0, victim, TO_CHAR);
					act("Your leg buckles beneath you as $n's slash tears deep into muscle.", ch, 0, victim, TO_VICT);
					act("$N's leg buckles beneath $m as $n's slash tears deep into muscle.", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 8);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					init_affect(&af2);
					af2.where = TO_AFFECTS;
					af2.duration = ch->level / 15;
					af2.type = gsn_bleeding;
					af2.level = ch->level;
					af2.location = APPLY_NONE;
					af2.modifier = 0;
					af2.aftype = AFT_INVIS;
					af2.tick_fun = bleeding_tick;
					af2.end_fun = nullptr;
					af2.owner = ch;
					new_affect_to_char(victim, &af2);
					break;
				case WEAPON_SWORD:
					act("$N's leg buckles beneath $m as your slash tears deep into muscle!", ch, 0, victim, TO_CHAR);
					act("Your leg buckles beneath you as $n's slash tears deep into muscle.", ch, 0, victim, TO_VICT);
					act("$N's leg buckles beneath $m as $n's slash tears deep into muscle.", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 8);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					init_affect(&af2);
					af2.where = TO_AFFECTS;
					af2.duration = ch->level / 15;
					af2.type = gsn_bleeding;
					af2.level = ch->level;
					af2.location = APPLY_NONE;
					af2.modifier = 0;
					af2.aftype = AFT_INVIS;
					af2.tick_fun = bleeding_tick;
					af2.end_fun = nullptr;
					af2.owner = ch;
					new_affect_to_char(victim, &af2);
					break;
				case WEAPON_FLAIL:
					act("You hear the chilling sound of snapping bone as you land a solid blow.", ch, 0, victim, TO_CHAR);
					act("You hear the chilling sound of snapping bone as $n lands a solid blow.", ch, 0, victim, TO_ROOM);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 6);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move / 2, 0);
					break;
				case WEAPON_STAFF:
					act("You hear the chilling sound of snapping bone as you land a solid blow.", ch, 0, victim, TO_CHAR);
					act("You hear the chilling sound of snapping bone as $n lands a solid blow.", ch, 0, victim, TO_ROOM);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 6);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move / 2, 0);
					break;
				case WEAPON_SPEAR:
					act("$N falters, clutching $S leg in agony as your spear pierces $M clean through!", ch, 0, victim, TO_CHAR);
					act("You falter, clutching your leg in agony as $n's spear pierces you clean through!", ch, 0, victim, TO_VICT);
					act("$N falters, clutching $S leg in agony as $n's spear pierces $M clean through!", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 7);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					victim->move = std::max(victim->move - ch->level / 2, 0);
					LAG_CHAR(victim, PULSE_VIOLENCE * 2);
					break;
				case WEAPON_DAGGER:
					act("$N collapses to the ground in agony as you sever a tendon!", ch, 0, victim, TO_CHAR);
					act("You collapse to the ground in agony as $n severs a tendon!", ch, 0, victim, TO_VICT);
					act("$N collapses to the ground in agony as $n severs a tendon!", ch, 0, victim, TO_NOTVICT);

					af.location = APPLY_DEX;
					af.modifier = -(ch->level / 5);
					af.aftype = AFT_MALADY;
					affect_join(victim, &af);

					LAG_CHAR(victim, PULSE_VIOLENCE * 2);
					break;
			}

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.duration = ch->level / 8;
			af.type = gsn_hobble;
			af.level = ch->level;
			af.location = APPLY_LEGS;
			af.modifier = -1;
			af.aftype = AFT_INVIS;
			affect_to_char(victim, &af);

			one_hit_new(ch, victim, gsn_hobble, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 120, nullptr);
		}
		else
		{
			one_hit_new(ch, victim, gsn_hobble, HIT_SPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 80, nullptr);

			if (!is_affected(victim, gsn_hobble))
			{
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.duration = ch->level / 8;
				af.type = gsn_hobble;
				af.level = ch->level;
				af.location = APPLY_DEX;

				switch (weapon->value[0])
				{
					case WEAPON_MACE:
						af.modifier = -(ch->level / 10);
						break;
					case WEAPON_AXE:
						af.modifier = -(ch->level / 12);
						break;
					case WEAPON_SWORD:
						af.modifier = -(ch->level / 12);
						break;
					case WEAPON_FLAIL:
						af.modifier = -(ch->level / 10);
						break;
					case WEAPON_STAFF:
						af.modifier = -(ch->level / 10);
						break;
					case WEAPON_SPEAR:
						af.modifier = -(ch->level / 12);
						break;
					case WEAPON_DAGGER:
						af.modifier = -(ch->level / 8);
						break;
				}

				af.aftype = AFT_MALADY;
				affect_to_char(victim, &af);
			}
		}

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		check_improve(ch, gsn_hobble, true, 1);
	}
	else
	{
		damage(ch, victim, 0, gsn_hobble, DAM_NONE, true);
		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		check_improve(ch, gsn_hobble, false, 1);
	}
}